

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O1

void TryRunTics(void)

{
  int iVar1;
  uint uVar2;
  _func_int_int **pp_Var3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  AActor *listenactor;
  uint uVar10;
  
  if (pauseext) {
    r_NoInterpolate = true;
  }
  bVar7 = r_NoInterpolate | cl_capfps.Value;
  if ((bVar7 & 1) == 0) {
    iVar9 = 0;
    pp_Var3 = (_func_int_int **)&I_GetTime;
  }
  else {
    pp_Var3 = &I_WaitForTic;
    iVar9 = oldentertics;
  }
  entertic = (**pp_Var3)(SUB41(iVar9,0));
  uVar10 = entertic - oldentertics;
  oldentertics = entertic;
  NetUpdate();
  if (pauseext != false) {
    return;
  }
  iVar9 = 0x7fffffff;
  if (0 < (long)doomcom.numnodes) {
    piVar5 = nettics;
    lVar6 = 0;
    do {
      if ((nodeingame[lVar6] == true) && (*piVar5 < iVar9)) {
        iVar9 = *piVar5;
      }
      lVar6 = lVar6 + 1;
      piVar5 = piVar5 + 1;
    } while (doomcom.numnodes != lVar6);
  }
  iVar1 = gametic;
  if (ticdup != 1) {
    iVar1 = gametic / ticdup;
  }
  uVar4 = iVar9 - iVar1;
  uVar2 = uVar4;
  if ((int)uVar10 < (int)uVar4) {
    uVar2 = uVar10;
  }
  if ((int)uVar10 < (int)(uVar4 - 1)) {
    uVar2 = uVar10 + 1;
  }
  if ((bVar7 & 1) == 0 && uVar2 == 0) {
    Net_CheckLastReceived(0);
    if ((int)uVar10 < 1) {
      return;
    }
  }
  else {
    uVar8 = 1;
    if (1 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    if (debugfile != (FILE *)0x0) {
      fprintf((FILE *)debugfile,"=======real: %i  avail: %i  game: %i\n",(ulong)uVar10,(ulong)uVar4,
              uVar8);
    }
    do {
      if (gametic + (int)uVar8 <= iVar9) {
        hadlate = false;
        lVar6 = 0xf4;
        do {
          *(undefined1 *)((long)&players + lVar6) = 0;
          lVar6 = lVar6 + 0x2a0;
        } while (lVar6 != 0x15f4);
        lastglobalrecvtime = (*I_GetTime)(false);
        P_UnPredictPlayer();
        do {
          if (iVar9 < gametic) {
            I_Error("gametic>lowtic");
          }
          if (advancedemo == true) {
            D_DoAdvanceDemo();
          }
          if (debugfile != (FILE *)0x0) {
            fprintf((FILE *)debugfile,"run tic %d\n",(ulong)(uint)gametic);
          }
          uVar10 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar10;
          C_Ticker();
          M_Ticker();
          (*I_GetTime)(true);
          G_Ticker();
          gametic = gametic + 1;
          NetUpdate();
        } while (uVar10 != 0);
        P_PredictPlayer((player_t *)(&players + (long)consoleplayer * 0x54));
        listenactor = (AActor *)(&DAT_017e5fc8)[(long)consoleplayer * 0x54];
        if ((listenactor != (AActor *)0x0) &&
           (((listenactor->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (&DAT_017e5fc8)[(long)consoleplayer * 0x54] = 0;
          listenactor = (AActor *)0x0;
        }
        S_UpdateSounds(listenactor);
        return;
      }
      NetUpdate();
      iVar9 = 0x7fffffff;
      if (0 < (long)doomcom.numnodes) {
        piVar5 = nettics;
        lVar6 = 0;
        do {
          if ((nodeingame[lVar6] == true) && (*piVar5 < iVar9)) {
            iVar9 = *piVar5;
          }
          lVar6 = lVar6 + 1;
          piVar5 = piVar5 + 1;
        } while (doomcom.numnodes != lVar6);
      }
      iVar9 = iVar9 * ticdup;
      if (iVar9 < gametic) {
        I_Error("TryRunTics: lowtic < gametic");
      }
      Net_CheckLastReceived((int)uVar8);
      iVar1 = (*I_GetTime)(false);
    } while (iVar1 <= entertic);
  }
  C_Ticker();
  M_Ticker();
  P_UnPredictPlayer();
  P_PredictPlayer((player_t *)(&players + (long)consoleplayer * 0x54));
  return;
}

Assistant:

void TryRunTics (void)
{
	int 		i;
	int 		lowtic;
	int 		realtics;
	int 		availabletics;
	int 		counts;
	int 		numplaying;

	// If paused, do not eat more CPU time than we need, because it
	// will all be wasted anyway.
	if (pauseext) 
		r_NoInterpolate = true;
	bool doWait = cl_capfps || r_NoInterpolate /*|| netgame*/;

	// get real tics
	if (doWait)
	{
		entertic = I_WaitForTic (oldentertics);
	}
	else
	{
		entertic = I_GetTime (false);
	}
	realtics = entertic - oldentertics;
	oldentertics = entertic;

	// get available tics
	NetUpdate ();

	if (pauseext)
		return;

	lowtic = INT_MAX;
	numplaying = 0;
	for (i = 0; i < doomcom.numnodes; i++)
	{
		if (nodeingame[i])
		{
			numplaying++;
			if (nettics[i] < lowtic)
				lowtic = nettics[i];
		}
	}

	if (ticdup == 1)
	{
		availabletics = lowtic - gametic;
	}
	else
	{
		availabletics = lowtic - gametic / ticdup;
	}

	// decide how many tics to run
	if (realtics < availabletics-1)
		counts = realtics+1;
	else if (realtics < availabletics)
		counts = realtics;
	else
		counts = availabletics;
	
	// Uncapped framerate needs seprate checks
	if (counts == 0 && !doWait)
	{
		// Check possible stall conditions
		Net_CheckLastReceived(counts);
		if (realtics >= 1)
		{
			C_Ticker();
			M_Ticker();
			// Repredict the player for new buffered movement
			P_UnPredictPlayer();
			P_PredictPlayer(&players[consoleplayer]);
		}
		return;
	}

	if (counts < 1)
		counts = 1;

	if (debugfile)
		fprintf (debugfile,
				 "=======real: %i  avail: %i  game: %i\n",
				 realtics, availabletics, counts);

	// wait for new tics if needed
	while (lowtic < gametic + counts)
	{
		NetUpdate ();
		lowtic = INT_MAX;

		for (i = 0; i < doomcom.numnodes; i++)
			if (nodeingame[i] && nettics[i] < lowtic)
				lowtic = nettics[i];

		lowtic = lowtic * ticdup;

		if (lowtic < gametic)
			I_Error ("TryRunTics: lowtic < gametic");

		// Check possible stall conditions
		Net_CheckLastReceived (counts);

		// don't stay in here forever -- give the menu a chance to work
		if (I_GetTime (false) - entertic >= 1)
		{
			C_Ticker ();
			M_Ticker ();
			// Repredict the player for new buffered movement
			P_UnPredictPlayer();
			P_PredictPlayer(&players[consoleplayer]);
			return;
		}
	}

	//Tic lowtic is high enough to process this gametic. Clear all possible waiting info
	hadlate = false;
	for (i = 0; i < MAXPLAYERS; i++)
		players[i].waiting = false;
	lastglobalrecvtime = I_GetTime (false); //Update the last time the game tic'd over

	// run the count tics
	if (counts > 0)
	{
		P_UnPredictPlayer();
		while (counts--)
		{
			if (gametic > lowtic)
			{
				I_Error ("gametic>lowtic");
			}
			if (advancedemo)
			{
				D_DoAdvanceDemo ();
			}
			if (debugfile) fprintf (debugfile, "run tic %d\n", gametic);
			C_Ticker ();
			M_Ticker ();
			I_GetTime (true);
			G_Ticker();
			gametic++;

			NetUpdate ();	// check for new console commands
		}
		P_PredictPlayer(&players[consoleplayer]);
		S_UpdateSounds (players[consoleplayer].camera);	// move positional sounds
	}
}